

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.cpp
# Opt level: O1

void __thiscall column::fromString(column *this,string *str)

{
  int iVar1;
  char *__nptr;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  string tmp;
  char *local_70 [2];
  char local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  std::__cxx11::string::find((char *)str,0x123b4a,0);
  std::__cxx11::string::substr((ulong)local_70,(ulong)str);
  std::__cxx11::string::operator=((string *)&this->name,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  std::__cxx11::string::substr((ulong)local_70,(ulong)str);
  iVar2 = std::__cxx11::string::compare((char *)local_70);
  if (iVar2 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->flag,0,(char *)(this->flag)._M_string_length,0x1208a4);
    this->element_size = 8;
    iVar2 = 8;
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (iVar2 != 0) goto LAB_0011c06e;
    std::__cxx11::string::_M_replace
              ((ulong)&this->flag,0,(char *)(this->flag)._M_string_length,0x1206d1);
    std::__cxx11::string::find((char *)local_70,0x123706,0);
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
    std::__cxx11::string::operator=((string *)local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    __nptr = local_70[0];
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(__nptr,local_50,10);
    if (local_50[0] == __nptr) {
      std::__throw_invalid_argument("stoi");
LAB_0011c098:
      uVar5 = std::__throw_out_of_range("stoi");
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      _Unwind_Resume(uVar5);
    }
    iVar2 = (int)lVar4;
    if ((iVar2 != lVar4) || (*piVar3 == 0x22)) goto LAB_0011c098;
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    this->element_size = iVar2;
    iVar2 = iVar2 + 1;
  }
  this->element_truesize = iVar2;
LAB_0011c06e:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void column::fromString(const string &str){
    int idx = str.find(":");
    name = str.substr(0, idx);
    string tmp = str.substr(idx+1);
    if(tmp == "INT"){
        flag = "INT";
        element_size = 8;
        element_truesize = 8;
    }
    else if(tmp.substr(0, 4) == "CHAR"){
        flag = "CHAR";
        idx = tmp.find(")");
        tmp  = tmp.substr(5, idx-5);
        element_size = stoi(tmp);
        element_truesize = element_size + 1;
    }
}